

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrLDA0xb1(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = indirect_indexed_addr(in_RDI);
  LDA(in_RDI,argument);
  return 5;
}

Assistant:

int CPU::instrLDA0xb1() {
	LDA(indirect_indexed_addr());
	return 5;
}